

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::Mode5TransponderSupplementalData
          (Mode5TransponderSupplementalData *this,KBOOL Squitter,KBOOL Lvl2Squitter,
          KUINT8 IFFMission)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  byte local_13;
  byte local_12;
  byte local_11;
  KUINT8 IFFMission_local;
  KBOOL Lvl2Squitter_local;
  Mode5TransponderSupplementalData *pMStack_10;
  KBOOL Squitter_local;
  Mode5TransponderSupplementalData *this_local;
  
  local_13 = IFFMission;
  local_12 = Lvl2Squitter;
  local_11 = Squitter;
  pMStack_10 = this;
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5TransponderSupplementalData_00333070;
  if (7 < local_13) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Mode5TransponderSupplementalData",&local_39);
    KException::KException(this_00,&local_38,4);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  (this->m_SupplementalDataUnion).m_ui8SupplementalData = '\0';
  (this->m_SupplementalDataUnion).m_ui8SupplementalData =
       (this->m_SupplementalDataUnion).m_ui8SupplementalData & 0xfe | local_11 & 1;
  (this->m_SupplementalDataUnion).m_ui8SupplementalData =
       (this->m_SupplementalDataUnion).m_ui8SupplementalData & 0xfd | (local_12 & 1) << 1;
  (this->m_SupplementalDataUnion).m_ui8SupplementalData =
       (this->m_SupplementalDataUnion).m_ui8SupplementalData & 0xe3 | (local_13 & 7) << 2;
  return;
}

Assistant:

Mode5TransponderSupplementalData::Mode5TransponderSupplementalData(KBOOL Squitter, KBOOL Lvl2Squitter,
																   KUINT8 IFFMission) noexcept(false)
{
	if( IFFMission > 7 )throw KException( __FUNCTION__, DATA_TYPE_TOO_LARGE );
	m_SupplementalDataUnion.m_ui8SupplementalData = 0;
	m_SupplementalDataUnion.m_ui8SquitterStatus = Squitter;
	m_SupplementalDataUnion.m_ui8Lvl2SquitterStatus = Lvl2Squitter;
	m_SupplementalDataUnion.m_ui8IFFMission = IFFMission;
}